

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O0

string * ApprovalTests::FileUtils::readFileThrowIfMissing(string *fileName)

{
  byte bVar1;
  char *pcVar2;
  runtime_error *this;
  streambuf *psVar3;
  string *in_RDI;
  stringstream written;
  ifstream in;
  string *text;
  stringstream local_3d8 [16];
  undefined1 local_3c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  string local_248 [48];
  long local_218 [67];
  
  pcVar2 = (char *)::std::__cxx11::string::c_str();
  ::std::ifstream::ifstream(local_218,pcVar2,_S_in);
  bVar1 = ::std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    ::std::runtime_error::runtime_error(this,local_248);
    __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::stringstream::stringstream(local_3d8);
  psVar3 = (streambuf *)::std::ifstream::rdbuf();
  ::std::ostream::operator<<(local_3c8,psVar3);
  ::std::ifstream::close();
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_3d8);
  ::std::ifstream::~ifstream(local_218);
  return in_RDI;
}

Assistant:

std::string FileUtils::readFileThrowIfMissing(const std::string& fileName)
    {
        std::ifstream in(fileName.c_str(), std::ios_base::in);
        if (!in)
        {
            throw std::runtime_error("File does not exist: " + fileName);
        }
        std::stringstream written;
        written << in.rdbuf();
        in.close();

        std::string text = written.str();
        return text;
    }